

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppression::SerializeWithCachedSizes
          (NonMaximumSuppression *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  string *psVar5;
  double dVar6;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NonMaximumSuppression *this_local;
  
  bVar1 = has_picktop(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->SuppressionMethod_).picktop_)->super_MessageLite,output);
  }
  bVar1 = has_stringclasslabels(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  bVar1 = has_int64classlabels(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  dVar6 = iouthreshold(this);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar6 = iouthreshold(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(0x6e,dVar6,output);
  }
  dVar6 = confidencethreshold(this);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar6 = confidencethreshold(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(0x6f,dVar6,output);
  }
  confidenceinputfeaturename_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    confidenceinputfeaturename_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    confidenceinputfeaturename_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName");
    psVar5 = confidenceinputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(200,psVar5,output);
  }
  coordinatesinputfeaturename_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    coordinatesinputfeaturename_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    coordinatesinputfeaturename_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName");
    psVar5 = coordinatesinputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xc9,psVar5,output);
  }
  iouthresholdinputfeaturename_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    iouthresholdinputfeaturename_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    iouthresholdinputfeaturename_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName");
    psVar5 = iouthresholdinputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xca,psVar5,output);
  }
  confidencethresholdinputfeaturename_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    confidencethresholdinputfeaturename_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    confidencethresholdinputfeaturename_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName");
    psVar5 = confidencethresholdinputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xcb,psVar5,output);
  }
  confidenceoutputfeaturename_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    confidenceoutputfeaturename_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    confidenceoutputfeaturename_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName");
    psVar5 = confidenceoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xd2,psVar5,output);
  }
  coordinatesoutputfeaturename_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    coordinatesoutputfeaturename_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    coordinatesoutputfeaturename_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,iVar2,SERIALIZE,
               "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName");
    psVar5 = coordinatesoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xd3,psVar5,output);
  }
  return;
}

Assistant:

void NonMaximumSuppression::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NonMaximumSuppression)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
  if (has_picktop()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *SuppressionMethod_.picktop_, output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // double iouThreshold = 110;
  if (this->iouthreshold() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(110, this->iouthreshold(), output);
  }

  // double confidenceThreshold = 111;
  if (this->confidencethreshold() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(111, this->confidencethreshold(), output);
  }

  // string confidenceInputFeatureName = 200;
  if (this->confidenceinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->confidenceinputfeaturename().data(), this->confidenceinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      200, this->confidenceinputfeaturename(), output);
  }

  // string coordinatesInputFeatureName = 201;
  if (this->coordinatesinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->coordinatesinputfeaturename().data(), this->coordinatesinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      201, this->coordinatesinputfeaturename(), output);
  }

  // string iouThresholdInputFeatureName = 202;
  if (this->iouthresholdinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->iouthresholdinputfeaturename().data(), this->iouthresholdinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      202, this->iouthresholdinputfeaturename(), output);
  }

  // string confidenceThresholdInputFeatureName = 203;
  if (this->confidencethresholdinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->confidencethresholdinputfeaturename().data(), this->confidencethresholdinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      203, this->confidencethresholdinputfeaturename(), output);
  }

  // string confidenceOutputFeatureName = 210;
  if (this->confidenceoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->confidenceoutputfeaturename().data(), this->confidenceoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      210, this->confidenceoutputfeaturename(), output);
  }

  // string coordinatesOutputFeatureName = 211;
  if (this->coordinatesoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->coordinatesoutputfeaturename().data(), this->coordinatesoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      211, this->coordinatesoutputfeaturename(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NonMaximumSuppression)
}